

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_file_hash.c
# Opt level: O2

ion_status_t oafh_delete(ion_file_hashmap_t *hash_map,ion_key_t key)

{
  int iVar1;
  int iVar2;
  ion_err_t iVar3;
  undefined1 *__ptr;
  ion_status_t iVar4;
  uint uVar5;
  size_t __size;
  int loc;
  
  iVar3 = oafh_find_item_loc(hash_map,key,&loc);
  if (iVar3 == '\x01') {
    iVar4.error = '\x01';
    iVar4._1_3_ = 0;
    iVar4.count = 0;
  }
  else {
    iVar1 = (hash_map->super).record.key_size;
    iVar2 = (hash_map->super).record.value_size;
    uVar5 = iVar2 + iVar1;
    __size = (long)iVar2 + (long)iVar1 + 1;
    __ptr = (undefined1 *)malloc(__size);
    fseek((FILE *)hash_map->file,(long)(int)__size * (long)loc,0);
    fread(__ptr,1,1,(FILE *)hash_map->file);
    fread(__ptr + 1,(long)(int)uVar5,1,(FILE *)hash_map->file);
    *__ptr = 0xfe;
    fseek((FILE *)hash_map->file,(long)(int)~uVar5,1);
    fputc(-2,(FILE *)hash_map->file);
    fwrite(__ptr + 1,(long)(int)uVar5,1,(FILE *)hash_map->file);
    free(__ptr);
    iVar4.error = '\0';
    iVar4._1_3_ = 0;
    iVar4.count = 1;
  }
  return iVar4;
}

Assistant:

ion_status_t
oafh_delete(
	ion_file_hashmap_t	*hash_map,
	ion_key_t			key
) {
	int loc;

	if (oafh_find_item_loc(hash_map, key, &loc) == err_item_not_found) {
#if ION_DEBUG
		printf("Item not found when trying to oah_delete.\n");
#endif
		return ION_STATUS_ERROR(err_item_not_found);
	}
	else {
		/* locate item */
		ion_hash_bucket_t *item;

		int record_size = hash_map->super.record.key_size + hash_map->super.record.value_size + SIZEOF(STATUS);

		item = malloc(record_size);

		/* set file position */
		fseek(hash_map->file, loc * record_size, SEEK_SET);

		fread(&item->status, SIZEOF(STATUS), 1, hash_map->file);
		fread(item->data, record_size - SIZEOF(STATUS), 1, hash_map->file);

		item->status = ION_DELETED;	/* delete item */

		/* backup */
		fseek(hash_map->file, -record_size, SEEK_CUR);
		fwrite(&item->status, SIZEOF(STATUS), 1, hash_map->file);
		fwrite(item->data, record_size - SIZEOF(STATUS), 1, hash_map->file);

		free(item);
#if ION_DEBUG
		printf("Item deleted at location %d\n", loc);
#endif
		return ION_STATUS_OK(1);
	}
}